

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Mat *in_RSI;
  undefined8 *in_RDI;
  Mat top_blob_bordered;
  Mat top_blob_tm;
  int tiles;
  int h_tiles;
  int w_tiles;
  Mat bottom_blob_tm;
  Option opt_b;
  Mat bottom_blob_bordered;
  int outch;
  int outh;
  int outw;
  int inch;
  int h;
  int w;
  Option *in_stack_000022a8;
  Mat *in_stack_000022b0;
  Mat *in_stack_000022b8;
  int in_stack_000022c4;
  Mat *in_stack_000022c8;
  Allocator *in_stack_fffffffffffffb70;
  size_t in_stack_fffffffffffffb78;
  undefined8 in_stack_fffffffffffffb80;
  int _c;
  void **ppvVar4;
  undefined8 in_stack_fffffffffffffb88;
  Mat *in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffb98;
  Mat *pMVar5;
  int in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  Mat *in_stack_fffffffffffffba8;
  Mat *in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbc0;
  Mat *pMVar6;
  Option *in_stack_fffffffffffffbc8;
  Mat local_3f8;
  void *local_3b0;
  int *local_3a8;
  undefined8 local_3a0;
  undefined4 local_398;
  long *local_390;
  undefined4 local_388;
  undefined4 local_384;
  undefined4 local_380;
  undefined4 local_37c;
  undefined4 local_378;
  undefined8 local_370;
  void *local_368;
  int *local_360;
  undefined8 local_358;
  undefined4 local_350;
  long *local_348;
  undefined4 local_340;
  undefined4 local_33c;
  undefined4 local_338;
  undefined4 local_334;
  undefined4 local_330;
  undefined8 local_328;
  int local_31c;
  int local_318;
  int local_314;
  void *local_310;
  Option *opt_00;
  undefined4 uVar7;
  Mat *in_stack_fffffffffffffd08;
  Mat *top_blob_tm_00;
  Option *in_stack_fffffffffffffd28;
  Mat *in_stack_fffffffffffffd38;
  void *local_278;
  int *local_270;
  void *local_268;
  undefined4 local_260;
  long *local_258;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 local_240;
  void *local_238;
  int local_230;
  uint local_22c;
  uint local_228;
  undefined4 local_224;
  int local_220;
  int local_21c;
  Mat *local_200;
  void **local_1f0;
  void **local_1e8;
  void **local_1e0;
  Mat *local_1d8;
  void **local_1d0;
  Mat *local_1c0;
  void **local_1b0;
  void **local_1a0;
  void **local_190;
  int local_180;
  undefined4 local_17c;
  Mat *local_170;
  Mat *local_168;
  void **local_158;
  void **local_150;
  void **local_148;
  int local_140;
  undefined4 local_13c;
  void **local_138;
  Mat *local_128;
  int local_110;
  undefined4 local_10c;
  void **local_108;
  int local_f0;
  undefined4 local_ec;
  void **local_e8;
  int local_d0;
  undefined4 local_cc;
  void **local_c8;
  int local_b0;
  undefined4 local_ac;
  Mat *local_a8;
  int local_90;
  undefined4 local_8c;
  void **local_88;
  void **local_78;
  void *local_70;
  void *local_60;
  void *local_50;
  void *local_40;
  void *local_30;
  void *local_18;
  int local_10;
  undefined4 local_c;
  void **local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffffb80 >> 0x20);
  local_224 = *(undefined4 *)(in_RDI + 7);
  iVar1 = in_RSI->w;
  iVar2 = in_RSI->h;
  local_230 = in_RSI->c;
  local_78 = &local_278;
  local_278 = (void *)*in_RDI;
  local_270 = (int *)in_RDI[1];
  local_268 = (void *)in_RDI[2];
  local_260 = *(undefined4 *)(in_RDI + 3);
  local_258 = (long *)in_RDI[4];
  local_250 = *(undefined4 *)(in_RDI + 5);
  local_24c = *(undefined4 *)((long)in_RDI + 0x2c);
  local_248 = *(undefined4 *)(in_RDI + 6);
  local_244 = *(undefined4 *)((long)in_RDI + 0x34);
  local_240 = *(undefined4 *)(in_RDI + 7);
  local_238 = (void *)in_RDI[8];
  if (local_270 != (int *)0x0) {
    local_c = 1;
    LOCK();
    local_10 = *local_270;
    *local_270 = *local_270 + 1;
    UNLOCK();
  }
  local_228 = (iVar1 + 1) - (iVar1 + 1 >> 0x1f) & 0xfffffffe;
  local_22c = (iVar2 + 1) - (iVar2 + 1 >> 0x1f) & 0xfffffffe;
  local_21c = local_228 + 2;
  local_220 = local_22c + 2;
  local_200 = in_RSI;
  local_8 = local_78;
  copy_make_border(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,
                   in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20),
                   (int)in_stack_fffffffffffffb98,in_stack_fffffffffffffbc0,
                   (float)((ulong)in_stack_fffffffffffffb90 >> 0x20),in_stack_fffffffffffffbc8);
  local_1f0 = &local_310;
  local_310 = (void *)0x0;
  opt_00 = (Option *)0x0;
  pMVar5 = (Mat *)0x0;
  uVar7 = 0;
  top_blob_tm_00 = (Mat *)0x0;
  uVar7 = 0;
  pMVar6 = (Mat *)0x0;
  local_314 = (int)local_228 / 2;
  local_318 = (int)local_22c / 2;
  local_31c = local_314 * local_318;
  Mat::create(in_stack_fffffffffffffb90,(int)((ulong)in_stack_fffffffffffffb88 >> 0x20),
              (int)in_stack_fffffffffffffb88,_c,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70)
  ;
  conv3x3s1_winograd23_transform_input_sse
            (in_stack_fffffffffffffd38,pMVar6,in_stack_fffffffffffffd28);
  local_1e8 = &local_368;
  local_368 = (void *)0x0;
  local_360 = (int *)0x0;
  local_358 = 0;
  local_350 = 0;
  local_348 = (long *)0x0;
  local_340 = 0;
  local_33c = 0;
  local_338 = 0;
  local_334 = 0;
  local_330 = 0;
  local_328 = 0;
  local_158 = &local_368;
  local_150 = &local_278;
  if (&local_278 != local_158) {
    local_138 = &local_278;
    if (local_270 != (int *)0x0) {
      local_13c = 0xffffffff;
      LOCK();
      local_140 = *local_270;
      *local_270 = *local_270 + -1;
      UNLOCK();
      if (local_140 == 1) {
        if (local_258 == (long *)0x0) {
          local_18 = local_278;
          if (local_278 != (void *)0x0) {
            free(local_278);
          }
        }
        else {
          (**(code **)(*local_258 + 0x18))(local_258,local_278);
        }
      }
    }
    local_278 = (void *)0x0;
    local_268 = (void *)0x0;
    local_260 = 0;
    local_250 = 0;
    local_24c = 0;
    local_248 = 0;
    local_244 = 0;
    local_240 = 0;
    local_238 = (void *)0x0;
    local_270 = (int *)0x0;
    local_278 = *local_158;
    local_270 = (int *)local_158[1];
    local_268 = local_158[2];
    local_260 = *(undefined4 *)(local_158 + 3);
    local_258 = (long *)local_158[4];
    local_250 = *(undefined4 *)(local_158 + 5);
    local_24c = *(undefined4 *)((long)local_158 + 0x2c);
    local_248 = *(undefined4 *)(local_158 + 6);
    local_244 = *(undefined4 *)((long)local_158 + 0x34);
    local_240 = *(undefined4 *)(local_158 + 7);
    local_238 = local_158[8];
  }
  local_1d0 = &local_368;
  local_148 = &local_278;
  local_88 = local_1d0;
  if (local_360 != (int *)0x0) {
    local_8c = 0xffffffff;
    LOCK();
    local_90 = *local_360;
    *local_360 = *local_360 + -1;
    UNLOCK();
    if (local_90 == 1) {
      if (local_348 == (long *)0x0) {
        local_70 = local_368;
        if (local_368 != (void *)0x0) {
          free(local_368);
        }
      }
      else {
        (**(code **)(*local_348 + 0x18))(local_348,local_368);
      }
    }
  }
  local_368 = (void *)0x0;
  local_358 = 0;
  local_350 = 0;
  local_340 = 0;
  local_33c = 0;
  local_338 = 0;
  local_334 = 0;
  local_330 = 0;
  local_328 = 0;
  local_360 = (int *)0x0;
  local_1e0 = &local_3b0;
  local_3b0 = (void *)0x0;
  local_3a8 = (int *)0x0;
  local_3a0 = 0;
  local_398 = 0;
  local_390 = (long *)0x0;
  local_388 = 0;
  local_384 = 0;
  local_380 = 0;
  local_37c = 0;
  local_378 = 0;
  local_370 = 0;
  convolution_winograd_dot_sse
            (in_stack_000022c8,in_stack_000022c4,in_stack_000022b8,in_stack_000022b0,
             in_stack_000022a8);
  pMVar6 = &local_3f8;
  local_3f8.data = (void *)0x0;
  local_3f8.refcount = (int *)0x0;
  local_3f8.elemsize = 0;
  local_3f8.elempack = 0;
  local_3f8.allocator = (Allocator *)0x0;
  local_3f8.dims = 0;
  local_3f8.w = 0;
  local_3f8.h = 0;
  local_3f8.d = 0;
  local_3f8.c = 0;
  local_3f8.cstep = 0;
  local_1d8 = pMVar6;
  if ((local_228 == local_200->w) && (local_22c == local_200->h)) {
    local_170 = &local_3f8;
    local_168 = local_170;
    if (local_170 != local_200) {
      if (local_200->refcount != (int *)0x0) {
        piVar3 = local_200->refcount;
        local_17c = 1;
        LOCK();
        local_180 = *piVar3;
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      local_3f8.data = local_200->data;
      local_3f8.refcount = local_200->refcount;
      local_3f8.elemsize = local_200->elemsize;
      local_3f8.elempack = local_200->elempack;
      local_3f8.allocator = local_200->allocator;
      local_3f8.dims = local_200->dims;
      local_3f8.w = local_200->w;
      local_3f8.h = local_200->h;
      local_3f8.d = local_200->d;
      local_3f8.c = local_200->c;
      local_3f8.cstep = local_200->cstep;
      in_stack_fffffffffffffbb0 = local_170;
      local_128 = local_170;
    }
  }
  else {
    Mat::create(in_stack_fffffffffffffb90,(int)((ulong)in_stack_fffffffffffffb88 >> 0x20),
                (int)in_stack_fffffffffffffb88,_c,in_stack_fffffffffffffb78,
                in_stack_fffffffffffffb70);
  }
  conv3x3s1_winograd23_transform_output_sse(top_blob_tm_00,in_stack_fffffffffffffd08,pMVar5,opt_00);
  copy_cut_border(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,
                  in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20),
                  (int)in_stack_fffffffffffffb98,(Option *)pMVar6);
  pMVar5 = &local_3f8;
  local_1c0 = pMVar5;
  local_a8 = pMVar5;
  if (local_3f8.refcount != (int *)0x0) {
    local_ac = 0xffffffff;
    LOCK();
    local_b0 = *local_3f8.refcount;
    *local_3f8.refcount = *local_3f8.refcount + -1;
    UNLOCK();
    if (local_b0 == 1) {
      if (local_3f8.allocator == (Allocator *)0x0) {
        local_60 = local_3f8.data;
        if (local_3f8.data != (void *)0x0) {
          free(local_3f8.data);
        }
      }
      else {
        (*(local_3f8.allocator)->_vptr_Allocator[3])(local_3f8.allocator,local_3f8.data);
      }
    }
  }
  pMVar5->data = (void *)0x0;
  pMVar5->elemsize = 0;
  pMVar5->elempack = 0;
  pMVar5->dims = 0;
  pMVar5->w = 0;
  pMVar5->h = 0;
  pMVar5->d = 0;
  pMVar5->c = 0;
  pMVar5->cstep = 0;
  pMVar5->refcount = (int *)0x0;
  ppvVar4 = &local_3b0;
  local_1b0 = ppvVar4;
  local_c8 = ppvVar4;
  if (local_3a8 != (int *)0x0) {
    local_cc = 0xffffffff;
    LOCK();
    local_d0 = *local_3a8;
    *local_3a8 = *local_3a8 + -1;
    UNLOCK();
    if (local_d0 == 1) {
      if (local_390 == (long *)0x0) {
        local_50 = local_3b0;
        if (local_3b0 != (void *)0x0) {
          free(local_3b0);
        }
      }
      else {
        (**(code **)(*local_390 + 0x18))(local_390,local_3b0);
      }
    }
  }
  *ppvVar4 = (void *)0x0;
  ppvVar4[2] = (void *)0x0;
  *(undefined4 *)(ppvVar4 + 3) = 0;
  *(undefined4 *)(ppvVar4 + 5) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
  *(undefined4 *)(ppvVar4 + 6) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
  *(undefined4 *)(ppvVar4 + 7) = 0;
  ppvVar4[8] = (void *)0x0;
  ppvVar4[1] = (void *)0x0;
  ppvVar4 = &local_310;
  local_1a0 = ppvVar4;
  local_e8 = ppvVar4;
  if (opt_00 != (Option *)0x0) {
    local_ec = 0xffffffff;
    LOCK();
    local_f0 = *(int *)opt_00;
    *(int *)opt_00 = *(int *)opt_00 + -1;
    UNLOCK();
    if (local_f0 == 1) {
      if (top_blob_tm_00 == (Mat *)0x0) {
        local_40 = local_310;
        if (local_310 != (void *)0x0) {
          free(local_310);
        }
      }
      else {
        (**(code **)((long)top_blob_tm_00->data + 0x18))(top_blob_tm_00,local_310);
      }
    }
  }
  *ppvVar4 = (void *)0x0;
  ppvVar4[2] = (void *)0x0;
  *(undefined4 *)(ppvVar4 + 3) = 0;
  *(undefined4 *)(ppvVar4 + 5) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
  *(undefined4 *)(ppvVar4 + 6) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
  *(undefined4 *)(ppvVar4 + 7) = 0;
  ppvVar4[8] = (void *)0x0;
  ppvVar4[1] = (void *)0x0;
  ppvVar4 = &local_278;
  if (local_270 != (int *)0x0) {
    local_10c = 0xffffffff;
    LOCK();
    local_110 = *local_270;
    *local_270 = *local_270 + -1;
    UNLOCK();
    if (local_110 == 1) {
      local_190 = ppvVar4;
      local_108 = ppvVar4;
      if (local_258 == (long *)0x0) {
        local_30 = local_278;
        if (local_278 != (void *)0x0) {
          free(local_278);
        }
      }
      else {
        (**(code **)(*local_258 + 0x18))(local_258,local_278);
      }
    }
  }
  *ppvVar4 = (void *)0x0;
  ppvVar4[2] = (void *)0x0;
  *(undefined4 *)(ppvVar4 + 3) = 0;
  *(undefined4 *)(ppvVar4 + 5) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
  *(undefined4 *)(ppvVar4 + 6) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
  *(undefined4 *)(ppvVar4 + 7) = 0;
  ppvVar4[8] = (void *)0x0;
  ppvVar4[1] = (void *)0x0;
  return;
}

Assistant:

static void conv3x3s1_winograd23_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2, winograd F(2,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 2;
        int h_tiles = outh / 2;
        int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 16, inch, 4u, opt.workspace_allocator);
        conv3x3s1_winograd23_transform_input_sse(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_sse(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd23_transform_output_sse(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}